

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  _Ios_Seekdir _Var3;
  char *__s;
  long *plVar4;
  long sizeLimit;
  char c;
  string output;
  char hex [4];
  cmCommandArgumentsHelper argHelper;
  string fileName;
  cmCommandArgumentGroup group;
  string variable;
  cmCAString fileNameArg;
  cmCAString resultArg;
  cmCAString limitArg;
  cmCAString offsetArg;
  cmCAString readArg;
  cmCAEnabler hexOutputArg;
  ifstream file;
  bool local_5b9;
  cmCommand *local_5b8;
  string local_5b0;
  string local_590;
  undefined4 local_56c;
  cmCommandArgumentsHelper local_568;
  long *local_548;
  char *local_540;
  long local_538 [2];
  cmCommandArgumentGroup local_528;
  string local_508;
  cmCAString local_4e8;
  cmCAString local_470;
  cmCAString local_3f8;
  cmCAString local_380;
  cmCAString local_308;
  cmCAEnabler local_290;
  string local_238;
  byte abStack_218 [488];
  
  local_5b8 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"READ must be called with at least two additional arguments","")
    ;
    cmCommand::SetError(local_5b8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  local_568.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmCAString::cmCAString(&local_308,&local_568,"READ",(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&local_4e8,&local_568,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&local_470,&local_568,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString(&local_380,&local_568,"OFFSET",&local_528);
  cmCAString::cmCAString(&local_3f8,&local_568,"LIMIT",&local_528);
  cmCAEnabler::cmCAEnabler(&local_290,&local_568,"HEX",&local_528);
  cmCommandArgument::Follows(&local_308.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgument::Follows(&local_4e8.super_cmCommandArgument,&local_308.super_cmCommandArgument);
  cmCommandArgument::Follows(&local_470.super_cmCommandArgument,&local_4e8.super_cmCommandArgument);
  cmCommandArgumentGroup::Follows(&local_528,&local_470.super_cmCommandArgument);
  cmCommandArgumentsHelper::Parse
            (&local_568,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  local_548 = local_538;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_548,local_4e8.String._M_dataplus._M_p,
             local_4e8.String._M_dataplus._M_p + local_4e8.String._M_string_length);
  bVar1 = cmsys::SystemTools::FileIsFullPath((char *)local_548);
  if (!bVar1) {
    __s = cmMakefile::GetCurrentSourceDirectory(local_5b8->Makefile);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_548,0,local_540,(ulong)__s);
    std::operator+(&local_238,"/",&local_4e8.String);
    std::__cxx11::string::_M_append((char *)&local_548,(ulong)local_238._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,local_470.String._M_dataplus._M_p,
             local_470.String._M_dataplus._M_p + local_470.String._M_string_length);
  std::ifstream::ifstream(&local_238,(char *)local_548,_S_in);
  bVar1 = (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0;
  local_56c = (undefined4)
              CONCAT71((int7)((ulong)*(long *)(local_238._M_dataplus._M_p + -0x18) >> 8),bVar1);
  if (bVar1) {
    if (local_3f8.String._M_string_length == 0) {
      sizeLimit = -1;
    }
    else {
      iVar2 = atoi(local_3f8.String._M_dataplus._M_p);
      sizeLimit = (long)iVar2;
    }
    if (local_380.String._M_string_length == 0) {
      _Var3 = _S_beg;
    }
    else {
      _Var3 = atoi(local_380.String._M_dataplus._M_p);
    }
    std::istream::seekg((long)&local_238,_Var3);
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    local_5b0._M_string_length = 0;
    local_5b0.field_2._M_local_buf[0] = '\0';
    if (local_290.Enabled == true) {
      if (sizeLimit != 0) {
        do {
          plVar4 = (long *)std::istream::get((char *)&local_238);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
          sprintf((char *)&local_590,"%.2x",(ulong)local_5b9);
          std::__cxx11::string::append((char *)&local_5b0);
          sizeLimit = sizeLimit - (ulong)(0 < sizeLimit);
        } while (sizeLimit != 0);
      }
    }
    else {
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
      local_590._M_string_length = 0;
      local_590.field_2._M_local_buf[0] = '\0';
      local_5b9 = false;
      if (sizeLimit != 0) {
        do {
          bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&local_238,&local_590,&local_5b9,sizeLimit);
          if (!bVar1) break;
          if ((0 < sizeLimit) &&
             (sizeLimit = sizeLimit - (local_5b9 + local_590._M_string_length), sizeLimit < 1)) {
            sizeLimit = 0;
          }
          std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_590._M_dataplus._M_p);
          if (local_5b9 == true) {
            std::__cxx11::string::append((char *)&local_5b0);
          }
        } while (sizeLimit != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,
                          CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                                   local_590.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    cmMakefile::AddDefinition(local_5b8->Makefile,&local_508,local_5b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_0034b959;
  }
  else {
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5b0,"failed to open for reading (","");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_590._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,
                      CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                               local_590.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)&local_5b0);
    std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_548);
    cmCommand::SetError(local_5b8,&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_0034b959;
  }
  operator_delete(local_5b0._M_dataplus._M_p,
                  CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                           local_5b0.field_2._M_local_buf[0]) + 1);
LAB_0034b959:
  std::ifstream::~ifstream(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (local_548 != local_538) {
    operator_delete(local_548,local_538[0] + 1);
  }
  local_290.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006ebe38;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_290.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_3f8.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_006f1020;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.String._M_dataplus._M_p != &local_3f8.String.field_2) {
    operator_delete(local_3f8.String._M_dataplus._M_p,
                    local_3f8.String.field_2._M_allocated_capacity + 1);
  }
  local_3f8.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006ebe38;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_3f8.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_380.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_006f1020;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.String._M_dataplus._M_p != &local_380.String.field_2) {
    operator_delete(local_380.String._M_dataplus._M_p,
                    local_380.String.field_2._M_allocated_capacity + 1);
  }
  local_380.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006ebe38;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_380.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_470.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_006f1020;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.String._M_dataplus._M_p != &local_470.String.field_2) {
    operator_delete(local_470.String._M_dataplus._M_p,
                    local_470.String.field_2._M_allocated_capacity + 1);
  }
  local_470.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006ebe38;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_470.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_4e8.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_006f1020;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8.String._M_dataplus._M_p != &local_4e8.String.field_2) {
    operator_delete(local_4e8.String._M_dataplus._M_p,
                    local_4e8.String.field_2._M_allocated_capacity + 1);
  }
  local_4e8.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006ebe38;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_4e8.super_cmCommandArgument.ArgumentsBefore._M_t);
  local_308.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_006f1020;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.String._M_dataplus._M_p != &local_308.String.field_2) {
    operator_delete(local_308.String._M_dataplus._M_p,
                    local_308.String.field_2._M_allocated_capacity + 1);
  }
  local_308.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006ebe38;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_308.super_cmCommandArgument.ArgumentsBefore._M_t);
  if (local_528.ContainedArguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.ContainedArguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_528.ContainedArguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.ContainedArguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_568.Arguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_568.Arguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_568.Arguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.Arguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(undefined1)local_56c;
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg(&argHelper, "READ");
  cmCAString fileNameArg(&argHelper, CM_NULLPTR);
  cmCAString resultArg(&argHelper, CM_NULLPTR);

  cmCAString offsetArg(&argHelper, "OFFSET", &group);
  cmCAString limitArg(&argHelper, "LIMIT", &group);
  cmCAEnabler hexOutputArg(&argHelper, "HEX", &group);
  readArg.Follows(CM_NULLPTR);
  fileNameArg.Follows(&readArg);
  resultArg.Follows(&fileNameArg);
  group.Follows(&resultArg);
  argHelper.Parse(&args, CM_NULLPTR);

  std::string fileName = fileNameArg.GetString();
  if (!cmsys::SystemTools::FileIsFullPath(fileName.c_str())) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg.GetString();
  }

  std::string variable = resultArg.GetString();

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(
    fileName.c_str(), std::ios::in |
      (hexOutputArg.IsEnabled() ? std::ios::binary : std::ios::in));
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }

  // is there a limit?
  long sizeLimit = -1;
  if (!limitArg.GetString().empty()) {
    sizeLimit = atoi(limitArg.GetCString());
  }

  // is there an offset?
  long offset = 0;
  if (!offsetArg.GetString().empty()) {
    offset = atoi(offsetArg.GetCString());
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (hexOutputArg.IsEnabled()) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit != 0) && (file.get(c))) {
      char hex[4];
      sprintf(hex, "%.2x", c & 0xff);
      output += hex;
      if (sizeLimit > 0) {
        sizeLimit--;
      }
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (sizeLimit != 0 && cmSystemTools::GetLineFromStream(
                               file, line, &has_newline, sizeLimit)) {
      if (sizeLimit > 0) {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline) {
          sizeLimit--;
        }
        if (sizeLimit < 0) {
          sizeLimit = 0;
        }
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}